

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_audio_buffer_ref_map
                    (ma_audio_buffer_ref *pAudioBufferRef,void **ppFramesOut,ma_uint64 *pFrameCount)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ma_uint32 mVar4;
  ulong uVar5;
  ulong *in_RDX;
  long *in_RSI;
  long in_RDI;
  ma_uint64 frameCount;
  ma_uint64 framesAvailable;
  undefined8 local_38;
  undefined4 local_c;
  
  local_38 = 0;
  if (in_RSI != (long *)0x0) {
    *in_RSI = 0;
  }
  if (in_RDX != (ulong *)0x0) {
    local_38 = *in_RDX;
    *in_RDX = 0;
  }
  if (((in_RDI == 0) || (in_RSI == (long *)0x0)) || (in_RDX == (ulong *)0x0)) {
    local_c = MA_INVALID_ARGS;
  }
  else {
    uVar5 = *(long *)(in_RDI + 0x60) - *(long *)(in_RDI + 0x58);
    if (uVar5 < local_38) {
      local_38 = uVar5;
    }
    lVar2 = *(long *)(in_RDI + 0x68);
    lVar3 = *(long *)(in_RDI + 0x58);
    iVar1 = *(int *)(in_RDI + 0x4c);
    mVar4 = ma_get_bytes_per_sample(*(ma_format *)(in_RDI + 0x48));
    *in_RSI = lVar2 + lVar3 * (ulong)(mVar4 * iVar1);
    *in_RDX = local_38;
    local_c = MA_SUCCESS;
  }
  return local_c;
}

Assistant:

MA_API ma_result ma_audio_buffer_ref_map(ma_audio_buffer_ref* pAudioBufferRef, void** ppFramesOut, ma_uint64* pFrameCount)
{
    ma_uint64 framesAvailable;
    ma_uint64 frameCount = 0;

    if (ppFramesOut != NULL) {
        *ppFramesOut = NULL;    /* Safety. */
    }

    if (pFrameCount != NULL) {
        frameCount = *pFrameCount;
        *pFrameCount = 0;       /* Safety. */
    }

    if (pAudioBufferRef == NULL || ppFramesOut == NULL || pFrameCount == NULL) {
        return MA_INVALID_ARGS;
    }

    framesAvailable = pAudioBufferRef->sizeInFrames - pAudioBufferRef->cursor;
    if (frameCount > framesAvailable) {
        frameCount = framesAvailable;
    }

    *ppFramesOut = ma_offset_ptr(pAudioBufferRef->pData, pAudioBufferRef->cursor * ma_get_bytes_per_frame(pAudioBufferRef->format, pAudioBufferRef->channels));
    *pFrameCount = frameCount;

    return MA_SUCCESS;
}